

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

ushort __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::BuildFreeBitVector
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,SmallHeapBlockBitVector *free)

{
  undefined4 *puVar1;
  code *pcVar2;
  anon_class_24_3_be079e9c fn;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  BVIndex BVar6;
  FreeObject *this_00;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_01;
  ushort uVar7;
  uint uVar8;
  undefined8 *in_FS_OFFSET;
  SmallHeapBlockBitVector *local_50;
  SmallHeapBlockBitVector *free_local;
  SmallHeapBlockBitVector *local_40;
  ushort local_32;
  
  uVar7 = 0;
  local_50 = free;
  free_local = free;
  memset(free,0,0x100);
  this_00 = this->freeObjectList;
  if (this_00 != (FreeObject *)0x0) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    local_40 = &this->debugFreeBits;
    uVar7 = 0;
    do {
      if (((ulong)this_00 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar3) goto LAB_0020f033;
        *puVar1 = 0;
      }
      uVar8 = (uint)((ulong)this_00 >> 4) & 0x7ff;
      bVar3 = IsValidBitIndex(this,uVar8);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x766,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar3) goto LAB_0020f033;
        *puVar1 = 0;
      }
      BVar4 = BVStatic<2048UL>::Test(local_40,uVar8);
      if (BVar4 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x767,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar3) goto LAB_0020f033;
        *puVar1 = 0;
      }
      BVStatic<2048UL>::Set(free_local,uVar8);
      uVar7 = uVar7 + 1;
      this_00 = FreeObject::GetNext(this_00);
    } while (this_00 != (FreeObject *)0x0);
  }
  local_32 = uVar7;
  BVar6 = BVStatic<2048UL>::Count(&this->debugFreeBits);
  if (BVar6 != uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x76c,"(this->GetDebugFreeBitVector()->Count() == freeCount)",
                       "this->GetDebugFreeBitVector()->Count() == freeCount");
    if (!bVar3) goto LAB_0020f033;
    *puVar1 = 0;
  }
  uVar8 = (uint)(this->super_HeapBlock).heapBlockType;
  if ((uVar8 < 0xb) && ((0x528U >> (uVar8 & 0x1f) & 1) != 0)) {
    this_01 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    fn.free = &local_50;
    fn.this = this;
    fn.freeCount = &local_32;
    SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::BuildFreeBitVector(BVStatic<2048ul>*)::_lambda(unsigned_int)_1_>
              (this_01,fn);
    uVar5 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
            AddDisposedObjectFreeBitVector(this_01,local_50);
    uVar7 = uVar5 + local_32;
    local_32 = uVar7;
  }
  if (this->lastFreeCount < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x77f,"(freeCount <= this->lastFreeCount)",
                       "freeCount <= this->lastFreeCount");
    if (!bVar3) {
LAB_0020f033:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    uVar7 = local_32;
  }
  return uVar7;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::BuildFreeBitVector(SmallHeapBlockBitVector * free)
{
    free->ClearAll();
    ushort freeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        free->Set(bitIndex);
        freeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == freeCount);

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            free->Set(bitIndex);
            freeCount++;
        });

        // Include disposed objects
        freeCount += finalizableBlock->AddDisposedObjectFreeBitVector(free);
    }

    Assert(freeCount <= this->lastFreeCount);
    return freeCount;
}